

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  bool bVar1;
  int fd;
  int *piVar2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 uVar4;
  String local_30;
  int local_1c;
  undefined1 local_15;
  int gtest_retval;
  char status_ch;
  DeathTestImpl *pDStack_10;
  AbortReason reason_local;
  DeathTestImpl *this_local;
  
  gtest_retval = reason;
  pDStack_10 = this;
  if (reason == TEST_DID_NOT_DIE) {
    local_15 = 0x4c;
    uVar4 = local_15;
  }
  else {
    in_stack_ffffffffffffffb5 = 0x52;
    in_stack_ffffffffffffffb6 = 0x54;
    uVar4 = in_stack_ffffffffffffffb6;
    local_15 = in_stack_ffffffffffffffb6;
    if (reason != TEST_THREW_EXCEPTION) {
      in_stack_ffffffffffffffb6 = 0x52;
      uVar4 = in_stack_ffffffffffffffb6;
      local_15 = in_stack_ffffffffffffffb6;
    }
  }
  do {
    do {
      fd = write_fd(this);
      local_1c = posix::Write(fd,&local_15,1);
      uVar3 = false;
      if (local_1c == -1) {
        piVar2 = __errno_location();
        uVar3 = *piVar2 == 4;
      }
    } while ((bool)uVar3 != false);
    if (local_1c == -1) {
      String::Format(&local_30,"CHECK failed: File %s, line %d: %s != -1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x1b6,"posix::Write(write_fd(), &status_ch, 1)");
      DeathTestAbort(&local_30);
      String::~String((String *)
                      CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffb6,
                                              CONCAT15(in_stack_ffffffffffffffb5,
                                                       CONCAT14(uVar3,in_stack_ffffffffffffffb0)))))
      ;
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  _exit(1);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}